

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall ncnn::ParamDict::set(ParamDict *this,int id,Mat *v)

{
  anon_struct_80_3_b6d6cd30 *paVar1;
  int *piVar2;
  Allocator *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Mat *pMVar7;
  
  paVar1 = this->d->params + id;
  pMVar7 = &paVar1->v;
  paVar1->type = 4;
  if (pMVar7 != v) {
    piVar2 = v->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (paVar1->v).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pAVar3 = (paVar1->v).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          free(pMVar7->data);
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (paVar1->v).cstep = 0;
    pMVar7->data = (void *)0x0;
    (paVar1->v).refcount = (int *)0x0;
    *(undefined8 *)((long)&(paVar1->v).refcount + 4) = 0;
    *(undefined8 *)((long)&(paVar1->v).elemsize + 4) = 0;
    (paVar1->v).c = 0;
    (paVar1->v).dims = 0;
    (paVar1->v).w = 0;
    (paVar1->v).h = 0;
    (paVar1->v).d = 0;
    piVar2 = v->refcount;
    pMVar7->data = v->data;
    (paVar1->v).refcount = piVar2;
    (paVar1->v).elemsize = v->elemsize;
    (paVar1->v).elempack = v->elempack;
    (paVar1->v).allocator = v->allocator;
    iVar4 = v->w;
    iVar5 = v->h;
    iVar6 = v->d;
    (paVar1->v).dims = v->dims;
    (paVar1->v).w = iVar4;
    (paVar1->v).h = iVar5;
    (paVar1->v).d = iVar6;
    (paVar1->v).c = v->c;
    (paVar1->v).cstep = v->cstep;
  }
  return;
}

Assistant:

void ParamDict::set(int id, const Mat& v)
{
    d->params[id].type = 4;
    d->params[id].v = v;
}